

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void basic_suite::run(void)

{
  test_null();
  fail_null_empty();
  test_false();
  fail_false_empty();
  test_true();
  fail_true_empty();
  return;
}

Assistant:

void run()
{
    test_null();
    fail_null_empty();
    test_false();
    fail_false_empty();
    test_true();
    fail_true_empty();
}